

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixDynSize *outJacobian)

{
  bool bVar1;
  MatrixStorageOrdering local_5c;
  MatrixView<double> local_58;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)outJacobian,6);
  local_5c = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>(&local_58,outJacobian,&local_5c);
  bVar1 = getRelativeJacobianSparsityPattern(this,refFrameIndex,frameIndex,&local_58);
  return bVar1;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            iDynTree::MatrixDynSize & outJacobian) const
    {
        //I have the two links. Create the jacobian
        outJacobian.resize(6, pimpl->m_robot_model.getNrOfDOFs());

        return this->getRelativeJacobianSparsityPattern(refFrameIndex, frameIndex, MatrixView<double>(outJacobian));
    }